

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O3

void __thiscall KMeans::modelToQueries(KMeans *this)

{
  pointer *pppVar1;
  _WordT *p_Var2;
  _WordT _Var3;
  Aggregate *pAVar4;
  Query *pQVar5;
  ulong uVar6;
  iterator __position;
  vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>> *this_00;
  ulong uVar7;
  ulong uVar8;
  Aggregate *agg_1;
  Aggregate *agg;
  Aggregate *local_100;
  Aggregate *local_f8;
  pair<unsigned_long,_Query_*> local_f0 [12];
  
  pAVar4 = (Aggregate *)operator_new(0x30);
  (pAVar4->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar4->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar4->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pAVar4->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar4->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar4->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  local_f8 = pAVar4;
  memset(local_f0,0,0xc0);
  std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
  _M_realloc_insert<std::bitset<1500ul>>
            ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar4,(iterator)0x0
             ,(bitset<1500UL> *)local_f0);
  pQVar5 = (Query *)operator_new(0x30);
  (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
            ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar5->_aggregates,(iterator)0x0,
             &local_f8);
  pQVar5->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  _Var3 = (this->clusterVariables).super__Base_bitset<2UL>._M_w[1];
  (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] =
       (this->clusterVariables).super__Base_bitset<2UL>._M_w[0];
  (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = _Var3;
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pQVar5);
  countQuery = pQVar5;
  do {
    uVar7 = uVar8 >> 6;
    uVar6 = 1L << ((byte)uVar8 & 0x3f);
    if (((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[uVar7] >> (uVar8 & 0x3f)
        & 1) != 0) {
      pAVar4 = (Aggregate *)operator_new(0x30);
      (pAVar4->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar4->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar4->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pAVar4->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar4->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar4->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_100 = pAVar4;
      memset(local_f0,0,0xc0);
      std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
      _M_realloc_insert<std::bitset<1500ul>>
                ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar4,
                 (iterator)0x0,(bitset<1500UL> *)local_f0);
      pQVar5 = (Query *)operator_new(0x30);
      (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
      (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
      (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar5->_aggregates,(iterator)0x0
                 ,&local_100);
      pQVar5->_rootID = this->_queryRootIndex[uVar8];
      p_Var2 = (pQVar5->_fVars).super__Base_bitset<2UL>._M_w + uVar7;
      *p_Var2 = *p_Var2 | uVar6;
      QueryCompiler::addQuery
                ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pQVar5);
      local_f0[0].first = uVar8;
      local_f0[0].second = pQVar5;
      if (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[uVar7] &
          uVar6) == 0) {
        __position._M_current =
             (this->continuousQueries).
             super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        this_00 = (vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>>
                   *)&this->continuousQueries;
        if (__position._M_current ==
            (this->continuousQueries).
            super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001a3553;
        (__position._M_current)->first = uVar8;
        (__position._M_current)->second = pQVar5;
        pppVar1 = &(this->continuousQueries).
                   super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      else {
        __position._M_current =
             (this->categoricalQueries).
             super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        this_00 = (vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>>
                   *)&this->categoricalQueries;
        if (__position._M_current ==
            (this->categoricalQueries).
            super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_001a3553:
          std::
          vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>>::
          _M_realloc_insert<std::pair<unsigned_long,Query*>>(this_00,__position,local_f0);
        }
        else {
          (__position._M_current)->first = uVar8;
          (__position._M_current)->second = pQVar5;
          pppVar1 = &(this->categoricalQueries).
                     super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
      }
      this->varToQuery[uVar8] = pQVar5;
    }
    uVar8 = uVar8 + 1;
    if (uVar8 == 100) {
      return;
    }
  } while( true );
}

Assistant:

void KMeans::modelToQueries()
{
    // Count aggregate
    Aggregate* agg = new Aggregate();
    agg->_agg.push_back(prod_bitset());

    // Create count query
    Query* query = new Query();
    query->_aggregates.push_back(agg);
    query->_rootID = _td->_root->_id;
    query->_fVars = clusterVariables;

    _compiler->addQuery(query);        
    countQuery = query;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var) 
    {
        if (!_isFeature[var])
            continue;

        // Categorical variable
        Aggregate* agg = new Aggregate();
        agg->_agg.push_back(prod_bitset());

        // Create a query & Aggregate
        Query* query = new Query();
        query->_aggregates.push_back(agg);
        query->_rootID = _queryRootIndex[var];
        query->_fVars.set(var);

        _compiler->addQuery(query);
        
        if (_isCategoricalFeature[var])
        {
            // Categorical variable
            categoricalQueries.push_back({var,query});
        }
        else
        {
            // Continuous variable
            continuousQueries.push_back({var,query});
        }

        varToQuery[var] = query;
    }
}